

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_foreach.c
# Opt level: O2

int mpt_properties_foreach
              (_func_int_void_ptr_mpt_property_ptr *get,void *obj,mpt_property_handler_t proc,
              void *data,int match)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  mpt_property local_68;
  
  local_68._buf[0] = '\0';
  local_68._buf[1] = '\0';
  local_68._buf[2] = '\0';
  local_68._buf[3] = '\0';
  local_68._buf[4] = '\0';
  local_68._buf[5] = '\0';
  local_68._buf[6] = '\0';
  local_68._buf[7] = '\0';
  local_68._buf[8] = '\0';
  local_68._buf[9] = '\0';
  local_68._buf[10] = '\0';
  local_68._buf[0xb] = '\0';
  local_68._buf[0xc] = '\0';
  local_68._buf[0xd] = '\0';
  local_68._buf[0xe] = '\0';
  local_68._buf[0xf] = '\0';
  local_68.val._addr = (void *)0x0;
  local_68.val._type = 0;
  iVar3 = -1;
  local_68.desc = (char *)0x0;
  pcVar4 = (char *)0x1;
  while( true ) {
    local_68.name = (char *)0x0;
    iVar1 = (*get)(obj,&local_68);
    iVar2 = iVar3;
    if ((iVar1 < 0) ||
       ((local_68.desc = (char *)0x0, ((uint)(iVar1 == 0) * 0x10 + 0x10 & match) != 0 &&
        (iVar2 = (*proc)(data,&local_68), iVar2 < 0)))) break;
    iVar3 = iVar3 + 1;
    local_68.desc = pcVar4;
    pcVar4 = pcVar4 + 1;
  }
  return iVar2;
}

Assistant:

extern int mpt_properties_foreach(int (*get)(void *, MPT_STRUCT(property) *), void *obj, MPT_TYPE(property_handler) proc, void *data, int match)
{
	MPT_STRUCT(property) prop = MPT_PROPERTY_INIT;
	uintptr_t pos = 0;
	int err;
	
	prop.name = 0;
	prop.desc = 0;
	
	while ((err = get(obj, &prop)) >= 0) {
		prop.desc = 0;
		if (((err && (match & MPT_ENUM(TraverseChange)))
		     || (!err && (match & MPT_ENUM(TraverseDefault))))
		    && (err = proc(data, &prop)) < 0) {
			return err;
		}
		prop.name = 0;
		prop.desc = (void *)(++pos);
	}
	return pos - 1;
}